

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<double>_>::AddKel
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *source,TPZVec<long> *destination)

{
  complex<double> *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  complex<double> *pcVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  lVar2 = source->fNElements;
  if (0 < lVar2) {
    lVar13 = 0;
    do {
      lVar3 = destination->fStore[lVar13];
      lVar4 = source->fStore[lVar13];
      lVar12 = lVar13;
      do {
        lVar10 = destination->fStore[lVar12];
        lVar11 = lVar3 - lVar10;
        if (lVar3 - lVar10 == 0 || lVar3 < lVar10) {
          lVar11 = -(lVar3 - lVar10);
        }
        lVar5 = source->fStore[lVar12];
        if (lVar10 < lVar3) {
          lVar10 = lVar3;
        }
        lVar6 = (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
        if (((lVar6 <= lVar4 || lVar4 < 0) || (lVar5 < 0)) ||
           ((elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar7 = (this->fElem).fStore[lVar10];
        dVar8 = *(double *)(elmat->fElem[lVar6 * lVar5 + lVar4]._M_value + 8);
        pcVar1 = pcVar7 + lVar11;
        dVar9 = *(double *)(pcVar1->_M_value + 8);
        pcVar7 = pcVar7 + lVar11;
        *(double *)pcVar7->_M_value =
             *(double *)pcVar1->_M_value + *(double *)elmat->fElem[lVar6 * lVar5 + lVar4]._M_value;
        *(double *)(pcVar7->_M_value + 8) = dVar9 + dVar8;
        lVar12 = lVar12 + 1;
      } while (lVar12 < lVar2);
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar2);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::AddKel(TPZFMatrix<TVar>&elmat,
                                 TPZVec<int64_t> &source,
                                 TPZVec<int64_t> &destination)
{
    int64_t nelem = source.NElements();
    int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    for(icoef=0; icoef<nelem; icoef++) {
        ieq = destination[icoef];
        ieqs = source[icoef];
        for(jcoef=icoef; jcoef<nelem; jcoef++) {
            jeq = destination[jcoef];
            jeqs = source[jcoef];
            int64_t row(ieq), col(jeq);
            // invertendo linha-coluna para triangular superior
            if (row > col)
                this->Swap(&row, &col);
#ifdef PZDEBUG
            // checando limites
            if(row >= this->Dim() || col >= this->Dim()) {
                cout << "TPZSkylMatrix::GetVal index out of range row = " <<
                row << " col = " << col << endl;
                DebugStop();
            }
#endif
            // indice do vetor coluna
            int64_t index = col - row;
#ifdef PZDEBUG
            // checando limite da coluna
            if (index >= Size(col)) {
                cerr << "Try TPZSkylMatrix gZero." << endl;
                DebugStop();
            }
#endif
            // executando contribuição
            fElem[col][index] += elmat(ieqs,jeqs);

        }
    }
}